

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conn.cpp
# Opt level: O3

int __thiscall Conn::do_send(Conn *this,ConnInfo *conn_info)

{
  uint uVar1;
  int iVar2;
  char *__buf;
  ssize_t sVar3;
  uint *puVar4;
  const_iterator __pos;
  iterator iVar5;
  Buff *pBVar6;
  size_t __n;
  Buff *pBVar7;
  _Base_ptr p_Var8;
  int *piVar9;
  _Rb_tree<int,std::pair<int_const,ConnInfo>,std::_Select1st<std::pair<int_const,ConnInfo>>,std::less<int>,std::allocator<std::pair<int_const,ConnInfo>>>
  *this_00;
  uint uVar10;
  bool bVar11;
  tuple<> tStack_39;
  _Head_base<0UL,_const_int_&,_false> _Stack_38;
  ulong uStack_30;
  uint local_28;
  
  __buf = (conn_info->buf)._w_pos;
  __n = (long)(conn_info->buf)._r_pos - (long)__buf;
  if (__n == 0) {
    uVar10 = 0;
LAB_00103241:
    uStack_30 = 0x103273;
    local_28 = uVar10;
    fprintf(_stderr,"%s(%d)-<%s>: send fd: %d done, total nbytes: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
            ,0xaf,"do_send",(ulong)(uint)conn_info->fd);
    uStack_30 = 0x10327b;
    fflush(_stderr);
    pBVar6 = (Buff *)((conn_info->buf)._w_pos + uVar10);
    (conn_info->buf)._w_pos = (char *)pBVar6;
    pBVar7 = (Buff *)(conn_info->buf)._r_pos;
    if (pBVar7 == pBVar6) {
      pBVar6 = &conn_info->buf;
      (conn_info->buf)._r_pos = pBVar6->_buf;
      (conn_info->buf)._w_pos = pBVar6->_buf;
      pBVar7 = pBVar6;
    }
    if ((conn_info->readeof == true) && (pBVar7 == pBVar6)) {
      return -4;
    }
    return 0;
  }
  uStack_30 = 0x10321a;
  sVar3 = write(conn_info->fd,__buf,__n);
  uVar10 = (uint)sVar3;
  if (-1 < (int)uVar10) goto LAB_00103241;
  uStack_30 = 0x103227;
  puVar4 = (uint *)__errno_location();
  uVar10 = *puVar4;
  if (uVar10 == 0xb) {
    return 0;
  }
  uStack_30 = 0x1032d5;
  do_send();
  uVar1 = *(uint *)&(conn_info->ip)._M_dataplus._M_p;
  uStack_30 = (ulong)uVar1;
  if ((int)uVar10 <= (int)uVar1) {
    return uVar10 * 0xc + (int)(conn_info->ip)._M_string_length;
  }
  this_00 = (_Rb_tree<int,std::pair<int_const,ConnInfo>,std::_Select1st<std::pair<int_const,ConnInfo>>,std::less<int>,std::allocator<std::pair<int_const,ConnInfo>>>
             *)(ulong)uVar10;
  piVar9 = (int *)(ulong)uVar1;
  _Stack_38._M_head_impl = (int *)0x1032f7;
  Epoll::get();
  p_Var8 = *(_Base_ptr *)(this_00 + 0x10);
  __pos._M_node = (_Base_ptr)(this_00 + 8);
  if (p_Var8 != (_Base_ptr)0x0) {
    iVar2 = *piVar9;
    iVar5._M_node = __pos._M_node;
    do {
      if (iVar2 <= (int)p_Var8[1]._M_color) {
        iVar5._M_node = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[(int)p_Var8[1]._M_color < iVar2];
    } while (p_Var8 != (_Base_ptr)0x0);
    bVar11 = iVar5._M_node != __pos._M_node;
    __pos._M_node = iVar5._M_node;
    if ((bVar11) && ((int)iVar5._M_node[1]._M_color <= iVar2)) goto LAB_00103354;
  }
  _Stack_38._M_head_impl = piVar9;
  iVar5 = std::
          _Rb_tree<int,std::pair<int_const,ConnInfo>,std::_Select1st<std::pair<int_const,ConnInfo>>,std::less<int>,std::allocator<std::pair<int_const,ConnInfo>>>
          ::
          _M_emplace_hint_unique<std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<>>
                    (this_00,__pos,(piecewise_construct_t *)&std::piecewise_construct,
                     (tuple<const_int_&> *)&_Stack_38,&tStack_39);
LAB_00103354:
  return (int)iVar5._M_node + 0x28;
}

Assistant:

int Conn::do_send(ConnInfo *conn_info)
{
    Buff &buf = conn_info->buf;
    int nsend = 0;

    if (buf.data_size() > 0)
    {
        nsend = write(conn_info->fd, buf._w_pos, buf.data_size());
    }
    
    if (nsend < 0)
    {
        if (errno != EAGAIN)
        {
            LOG_PRINT("send fd: %d occurs error, error: %s", conn_info->fd, strerror(errno));
            exit(err_svr_send_error);
        }
    }
    else
    {
        LOG_PRINT("send fd: %d done, total nbytes: %d", conn_info->fd, nsend);
        buf.set_w_pos(nsend);
        if (conn_info->readeof && buf.data_size() == 0)
        {
            return err_svr_send_disconn;
        }
    }

    return err_svr_send_normal;
}